

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffeqty(fitsfile *fptr,int colnum,int *typecode,long *repeat,long *width,int *status)

{
  LONGLONG twidth;
  LONGLONG trepeat;
  long local_28;
  long local_20;
  
  ffeqtyll(fptr,colnum,typecode,&local_20,&local_28,status);
  if (repeat != (long *)0x0) {
    *repeat = local_20;
  }
  if (width != (long *)0x0) {
    *width = local_28;
  }
  return *status;
}

Assistant:

int ffeqty( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - column number                           */
            int *typecode,   /* O - datatype code (21 = short, etc)         */
            long *repeat,    /* O - repeat count of field                   */
            long *width,     /* O - if ASCII, width of field or unit string */
            int  *status)    /* IO - error status                           */
/*
  Get the 'equivalent' table column type. 

  This routine is similar to the ffgtcl routine (which returns the physical
  datatype of the column, as stored in the FITS file) except that if the
  TSCALn and TZEROn keywords are defined for the column, then it returns
  the 'equivalent' datatype.  Thus, if the column is defined as '1I'  (short
  integer) this routine may return the type as 'TUSHORT' or as 'TFLOAT'
  depending on the TSCALn and TZEROn values.
  
  Returns the datatype code of the column, as well as the vector
  repeat count and (if it is an ASCII character column) the
  width of the field or a unit string within the field.  This supports the
  TFORMn = 'rAw' syntax for specifying arrays of substrings, so
  if TFORMn = '60A12' then repeat = 60 and width = 12.
*/
{
    LONGLONG trepeat, twidth;
    
    ffeqtyll(fptr, colnum, typecode, &trepeat, &twidth, status);

    if (repeat)
        *repeat= (long) trepeat;

    if (width)
        *width = (long) twidth;

    return(*status);
}